

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O2

void __thiscall InstructionInfo::generateOperandStruct(InstructionInfo *this,ostream *out)

{
  long lVar1;
  pointer pFVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  vector<Field,_std::allocator<Field>_> *__range1;
  char *pcVar6;
  __normal_iterator<Field_*,_std::vector<Field,_std::allocator<Field>_>_> __i;
  long lVar7;
  pointer pFVar8;
  pointer pFVar9;
  vector<Field,_std::allocator<Field>_> sortedFields;
  
  poVar4 = std::operator<<(out,"struct Opcode_");
  poVar4 = std::operator<<(poVar4,(string *)this);
  std::operator<<(poVar4,"\n");
  std::operator<<(out,"{\n");
  std::operator<<(out,"    TranslatedOpcode opcode;\n");
  std::vector<Field,_std::allocator<Field>_>::vector(&sortedFields,&this->fields);
  pFVar2 = sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pFVar9 = sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.super__Vector_impl_data
      ._M_start !=
      sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    lVar7 = (long)sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                  super__Vector_impl_data._M_start;
    uVar5 = lVar7 / 0x30;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Field*,std::vector<Field,std::allocator<Field>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<InstructionInfo::generateOperandStruct(std::ostream&)::__0>>
              (sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
               super__Vector_impl_data._M_start,
               sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar7 < 0x301) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Field*,std::vector<Field,std::allocator<Field>>>,__gnu_cxx::__ops::_Iter_comp_iter<InstructionInfo::generateOperandStruct(std::ostream&)::__0>>
                (pFVar9,pFVar2);
    }
    else {
      pFVar8 = pFVar9 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Field*,std::vector<Field,std::allocator<Field>>>,__gnu_cxx::__ops::_Iter_comp_iter<InstructionInfo::generateOperandStruct(std::ostream&)::__0>>
                (pFVar9,pFVar8);
      for (; pFVar8 != pFVar2; pFVar8 = pFVar8 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Field*,std::vector<Field,std::allocator<Field>>>,__gnu_cxx::__ops::_Val_comp_iter<InstructionInfo::generateOperandStruct(std::ostream&)::__0>>
                  (pFVar8);
      }
    }
  }
  pFVar9 = sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->branch == true) {
    std::operator<<(out,"    uint32_t CIA;\n");
    pFVar9 = sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  for (; pFVar9 != sortedFields.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                   super__Vector_impl_data._M_finish; pFVar9 = pFVar9 + 1) {
    if (((pFVar9->name)._M_string_length != 0) && (pFVar9->match == false)) {
      std::operator<<(out,"    ");
      iVar3 = pFVar9->to - pFVar9->from;
      pcVar6 = "uint8_t";
      if (8 < iVar3) {
        pcVar6 = "uint16_t";
      }
      if (0x10 < iVar3) {
        pcVar6 = "uint32_t";
      }
      std::operator<<(out,pcVar6);
      poVar4 = std::operator<<(out," ");
      poVar4 = std::operator<<(poVar4,(string *)&pFVar9->name);
      std::operator<<(poVar4,";\n");
    }
  }
  std::operator<<(out,"};\n\n");
  std::vector<Field,_std::allocator<Field>_>::~vector(&sortedFields);
  return;
}

Assistant:

void InstructionInfo::generateOperandStruct(std::ostream& out)
{
    out << "struct Opcode_" << name << "\n";
    out << "{\n";
    out << "    TranslatedOpcode opcode;\n";

    auto sortedFields = fields;
    std::sort(sortedFields.begin(), sortedFields.end(), [](const Field& a, const Field& b) {
        return (a.to - a.from) > (b.to - b.from);
    });
    if(branch)
        out << "    uint32_t CIA;\n";

    for(const Field& f : sortedFields)
    {
        if(f.name.empty() || f.match)
            continue;
        out << "    ";
        if(f.to-f.from > 16)
            out << "uint32_t";
        else if(f.to-f.from > 8)
            out << "uint16_t";
        else
            out << "uint8_t";
        out << " " << f.name << ";\n";
    }
        
    out << "};\n\n";
}